

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O2

void mpc_sbox_verify_s128_256
               (mzd_local_t *out,mzd_local_t *in,view_t *view,rvec_t *rvec,mzd_local_t *mask_a,
               mzd_local_t *mask_b,mzd_local_t *mask_c)

{
  ulong uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  word128 x2m [2] [2];
  word128 r1s [2] [2];
  word128 r0s [2] [2];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 auStack_48 [8];
  word128 x1s [2] [2];
  
  auVar8 = *(undefined1 (*) [16])mask_a->w64;
  auVar9 = *(undefined1 (*) [16])(mask_a->w64 + 2);
  auVar3 = *(undefined1 (*) [16])mask_b->w64;
  auVar10 = *(undefined1 (*) [16])(mask_b->w64 + 2);
  auVar7 = *(undefined1 (*) [16])mask_c->w64;
  auVar15 = *(undefined1 (*) [16])(mask_c->w64 + 2);
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 0x20) {
    auVar11 = *(undefined1 (*) [16])((long)in->w64 + lVar2);
    auVar13 = *(undefined1 (*) [16])((long)in->w64 + lVar2 + 0x10);
    auVar12 = vandpd_avx(auVar11,auVar8);
    auVar4 = vandpd_avx(auVar11,auVar3);
    auVar11 = vandpd_avx(auVar11,auVar7);
    auVar5 = vandpd_avx(auVar13,auVar9);
    auVar6 = vandpd_avx(auVar13,auVar10);
    *(undefined1 (*) [16])(local_c8 + lVar2) = auVar11;
    auVar11 = vandpd_avx(auVar13,auVar15);
    auVar13 = vpslldq_avx(auVar12,8);
    auVar13 = vpshldq_avx512_vbmi2(auVar12,auVar13,2);
    *(undefined1 (*) [16])(local_b8 + lVar2) = auVar11;
    auVar11 = vpsrldq_avx(auVar12,8);
    auVar12 = vpsrlq_avx(auVar11,0x3e);
    *(undefined1 (*) [16])(local_188 + lVar2) = auVar13;
    auVar11 = vpslldq_avx(auVar5,8);
    auVar11 = vpshldq_avx512_vbmi2(auVar5,auVar11,2);
    auVar11 = vpor_avx(auVar11,auVar12);
    auVar13 = vpslldq_avx(auVar4,8);
    auVar13 = vpshldq_avx512_vbmi2(auVar4,auVar13,1);
    *(undefined1 (*) [16])(local_178 + lVar2) = auVar11;
    auVar11 = vpsrldq_avx(auVar4,8);
    auVar12 = vpsrlq_avx(auVar11,0x3f);
    *(undefined1 (*) [16])(local_1c8 + lVar2) = auVar13;
    auVar11 = vpslldq_avx(auVar6,8);
    auVar11 = vpshldq_avx512_vbmi2(auVar6,auVar11,1);
    auVar11 = vpor_avx(auVar11,auVar12);
    *(undefined1 (*) [16])(local_1b8 + lVar2) = auVar11;
    auVar11 = *(undefined1 (*) [16])((long)rvec + lVar2);
    auVar13 = *(undefined1 (*) [16])((long)rvec + lVar2 + 0x10);
    auVar12 = vandpd_avx(auVar11,auVar8);
    auVar4 = vandpd_avx(auVar11,auVar3);
    auVar11 = vandpd_avx(auVar11,auVar7);
    auVar5 = vandpd_avx(auVar13,auVar9);
    auVar6 = vandpd_avx(auVar13,auVar10);
    *(undefined1 (*) [16])(local_208 + lVar2) = auVar11;
    auVar11 = vandpd_avx(auVar13,auVar15);
    auVar13 = vpslldq_avx(auVar12,8);
    *(undefined1 (*) [16])(local_108 + lVar2) = auVar12;
    *(undefined1 (*) [16])(local_148 + lVar2) = auVar4;
    *(undefined1 (*) [16])(local_f8 + lVar2) = auVar5;
    *(undefined1 (*) [16])(local_138 + lVar2) = auVar6;
    auVar13 = vpshldq_avx512_vbmi2(auVar12,auVar13,2);
    *(undefined1 (*) [16])(local_1f8 + lVar2) = auVar11;
    auVar11 = vpsrldq_avx(auVar12,8);
    auVar12 = vpsrlq_avx(auVar11,0x3e);
    *(undefined1 (*) [16])(auStack_48 + lVar2) = auVar13;
    auVar11 = vpslldq_avx(auVar5,8);
    auVar11 = vpshldq_avx512_vbmi2(auVar5,auVar11,2);
    auVar11 = vpor_avx(auVar11,auVar12);
    auVar13 = vpslldq_avx(auVar4,8);
    auVar13 = vpshldq_avx512_vbmi2(auVar4,auVar13,1);
    *(undefined1 (*) [16])((long)x1s[0][0] + lVar2 + 8) = auVar11;
    auVar11 = vpsrldq_avx(auVar4,8);
    auVar12 = vpsrlq_avx(auVar11,0x3f);
    *(undefined1 (*) [16])(local_88 + lVar2) = auVar13;
    auVar11 = vpslldq_avx(auVar6,8);
    auVar11 = vpshldq_avx512_vbmi2(auVar6,auVar11,1);
    auVar11 = vpor_avx(auVar11,auVar12);
    *(undefined1 (*) [16])(local_78 + lVar2) = auVar11;
  }
  auVar8 = vpand_avx(local_1a8,local_188);
  auVar9 = vpand_avx(local_198,local_178);
  auVar3 = vpand_avx(local_188 ^ local_168,local_1c8);
  auVar10 = vpand_avx(local_178 ^ local_158,local_1b8);
  local_108 = vpternlogq_avx512vl(local_208 ^ local_1e8,auVar8,auVar3,0x96);
  local_f8 = vpternlogq_avx512vl(local_1f8 ^ local_1d8,auVar9,auVar10,0x96);
  *(undefined1 (*) [16])view = local_108;
  *(undefined1 (*) [16])(view->t + 2) = local_f8;
  auVar8 = *(undefined1 (*) [16])(view->t + 4);
  auVar9 = *(undefined1 (*) [16])(view->t + 6);
  auVar3 = vmovdqa64_avx512vl(local_88);
  auVar12 = vmovdqa64_avx512vl(local_78);
  local_e8 = vandpd_avx(auVar8,*(undefined1 (*) [16])mask_c->w64);
  local_d8 = vandpd_avx(auVar9,*(undefined1 (*) [16])(mask_c->w64 + 2));
  auVar4 = vpxorq_avx512vl(auVar3,local_68);
  auVar3 = vpand_avx(local_a8,local_188);
  auVar10 = vpand_avx(local_98,local_178);
  auVar5 = vpternlogq_avx512vl(local_1a8,local_c8,local_1c8,0x48);
  auVar7 = vpand_avx(local_a8,local_1c8);
  auVar6 = vpternlogq_avx512vl(local_198,local_b8,local_1b8,0x48);
  auVar15 = vpand_avx(local_98,local_1b8);
  auVar11 = vpand_avx(local_c8,local_188 ^ local_168);
  auVar13 = vpand_avx(local_b8,local_178 ^ local_158);
  auVar7 = vpternlogq_avx512vl(auVar4,auVar7,auVar5,0x96);
  auVar12 = vpxorq_avx512vl(auVar12,local_58);
  auVar14 = vpsrldq_avx512vl(auVar7,8);
  local_208 = vmovdqa64_avx512vl(auVar7);
  auVar7 = vpshldq_avx512_vbmi2(auVar14._0_16_,auVar7,0x3f);
  auVar14 = vpslldq_avx512vl(auVar9,8);
  auVar4 = vpshldq_avx512_vbmi2(auVar9,auVar14._0_16_,1);
  local_1f8 = vpternlogq_avx512vl(auVar12,auVar15,auVar6,0x96);
  auVar15 = vpsrldq_avx(local_1f8,8);
  auVar12 = vpslldq_avx(local_1f8,8);
  auVar15 = vpshldq_avx512_vbmi2(auVar15,local_1f8,0x3f);
  auVar12 = vpsllq_avx(auVar12,0x3f);
  auVar7 = vpternlogq_avx512vl(auVar7,local_108,auVar12,0x36);
  auVar5 = vpsrldq_avx(auVar8,8);
  *(undefined1 (*) [16])view = auVar7;
  auVar6 = vpsrlq_avx(auVar5,0x3f);
  auVar16 = vpslldq_avx(auVar8,8);
  *(undefined1 (*) [16])(view->t + 2) = local_f8 ^ auVar15;
  auVar12 = vpshldq_avx512_vbmi2(auVar8,auVar16,1);
  auVar4 = vpternlogq_avx512vl(auVar4,auVar6,*(undefined1 (*) [16])(mask_c->w64 + 2),0xa8);
  local_1e8 = vpand_avx(auVar12,*(undefined1 (*) [16])mask_c->w64);
  local_1d8 = vmovdqa64_avx512vl(auVar4);
  local_148 = vpternlogq_avx512vl(_auStack_48 ^ x1s._24_16_,auVar3,auVar11,0x96);
  auVar3 = vpsrldq_avx(local_148,8);
  auVar3 = vpshldq_avx512_vbmi2(auVar3,local_148,0x3e);
  local_138 = vpternlogq_avx512vl(x1s[0]._8_16_ ^ x1s[1]._8_16_,auVar10,auVar13,0x96);
  auVar10 = vpsrldq_avx(local_138,8);
  auVar11 = vpslldq_avx(local_138,8);
  auVar10 = vpshldq_avx512_vbmi2(auVar10,local_138,0x3e);
  auVar11 = vpsllq_avx(auVar11,0x3e);
  auVar3 = vpternlogq_avx512vl(auVar3,auVar7,auVar11,0x36);
  auVar8 = vpshldq_avx512_vbmi2(auVar8,auVar16,2);
  auVar9 = vpshldq_avx512_vbmi2(auVar9,auVar14._0_16_,2);
  *(undefined1 (*) [16])view = auVar3;
  *(undefined1 (*) [16])(view->t + 2) = auVar10 ^ local_f8 ^ auVar15;
  auVar3 = vpsrlq_avx(auVar5,0x3e);
  local_128 = vpand_avx(auVar8,*(undefined1 (*) [16])mask_c->w64);
  local_118 = vpternlogq_avx512vl(auVar9,auVar3,*(undefined1 (*) [16])(mask_c->w64 + 2),0xa8);
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 0x20) {
    uVar1 = *(ulong *)(local_178 + lVar2 + 8);
    auVar8._0_8_ = *(ulong *)(local_188 + lVar2) ^ *(ulong *)(local_208 + lVar2);
    auVar8._8_8_ = *(ulong *)(local_188 + lVar2 + 8) ^ *(ulong *)(local_208 + lVar2 + 8);
    auVar7._0_8_ = *(ulong *)(local_188 + lVar2) ^ *(ulong *)(local_1c8 + lVar2);
    auVar7._8_8_ = *(ulong *)(local_188 + lVar2 + 8) ^ *(ulong *)(local_1c8 + lVar2 + 8);
    auVar10._0_8_ = auVar7._0_8_ ^ *(ulong *)(local_148 + lVar2);
    auVar10._8_8_ = auVar7._8_8_ ^ *(ulong *)(local_148 + lVar2 + 8);
    *(undefined1 (*) [16])(local_208 + lVar2) = auVar8;
    auVar9 = vpsrldq_avx(auVar8,8);
    auVar3._0_8_ = *(ulong *)(local_178 + lVar2) ^ *(ulong *)(local_1f8 + lVar2);
    auVar3._8_8_ = uVar1 ^ *(ulong *)(local_1f8 + lVar2 + 8);
    auVar15._0_8_ = *(ulong *)(local_178 + lVar2) ^ *(ulong *)(local_1b8 + lVar2);
    auVar15._8_8_ = uVar1 ^ *(ulong *)(local_1b8 + lVar2 + 8);
    *(undefined1 (*) [16])(local_148 + lVar2) = auVar10;
    auVar13 = vpsrldq_avx(auVar10,8);
    auVar9 = vpshldq_avx512_vbmi2(auVar9,auVar8,0x3e);
    auVar11._0_8_ = auVar15._0_8_ ^ *(ulong *)(local_138 + lVar2);
    auVar11._8_8_ = auVar15._8_8_ ^ *(ulong *)(local_138 + lVar2 + 8);
    auVar8 = vpshldq_avx512_vbmi2(auVar13,auVar10,0x3f);
    auVar13 = vpsrldq_avx(auVar3,8);
    auVar10 = vpslldq_avx(auVar3,8);
    *(undefined1 (*) [16])(local_1f8 + lVar2) = auVar3;
    auVar3 = vpshldq_avx512_vbmi2(auVar13,auVar3,0x3e);
    auVar12 = vpslldq_avx(auVar11,8);
    auVar4 = vpsrldq_avx(auVar11,8);
    *(undefined1 (*) [16])(local_138 + lVar2) = auVar11;
    auVar13 = vpsllq_avx(auVar10,0x3e);
    auVar10 = vpshldq_avx512_vbmi2(auVar4,auVar11,0x3f);
    auVar11 = vpsllq_avx(auVar12,0x3f);
    auVar8 = vpor_avx(auVar11,auVar8);
    auVar9 = vpternlogq_avx512vl(auVar9,auVar8,auVar13,0x36);
    *(undefined1 (*) [16])(local_1b8 + lVar2) = auVar10;
    *(undefined1 (*) [16])(local_1c8 + lVar2) = auVar8;
    *(undefined1 (*) [16])(local_188 + lVar2) = auVar9;
    auVar8 = vpternlogq_avx512vl(auVar9,*(undefined1 (*) [16])(local_108 + lVar2) ^
                                        *(undefined1 (*) [16])(local_c8 + lVar2),auVar7,0x96);
    auVar9 = vpternlogq_avx512vl(*(undefined1 (*) [16])(local_f8 + lVar2) ^
                                 *(undefined1 (*) [16])(local_b8 + lVar2),auVar10 ^ auVar3,auVar15,
                                 0x96);
    *(undefined1 (*) [16])(local_178 + lVar2) = auVar10 ^ auVar3;
    *(undefined1 (*) [16])(local_108 + lVar2) = auVar8;
    *(undefined1 (*) [16])(local_f8 + lVar2) = auVar9;
    *(undefined1 (*) [16])((long)out->w64 + lVar2) = auVar8;
    *(undefined1 (*) [16])((long)out->w64 + lVar2 + 0x10) = auVar9;
  }
  return;
}

Assistant:

ATTR_TARGET_S128
static inline void mpc_sbox_verify_s128_256(mzd_local_t* out, const mzd_local_t* in, view_t* view,
                                            const rvec_t* rvec, const mzd_local_t* mask_a,
                                            const mzd_local_t* mask_b, const mzd_local_t* mask_c) {
  bitsliced_mm128_256_step_1(SC_VERIFY, mask_a, mask_b, mask_c);

  // a & b
  mpc_mm128_256_and_verify_def(NROLR, NROLR, r0m, x0s, x1s, r2m, mask_c, 0);
  // b & c
  mpc_mm128_256_and_verify_def(mm128_shift_left_256, mm128_shift_right_256, r2m, x1s, x2m, r1s,
                               mask_c, 1);
  // c & a
  mpc_mm128_256_and_verify_def(mm128_shift_left_256, mm128_shift_right_256, r1m, x0s, x2m, r0s,
                               mask_c, 2);

  bitsliced_mm128_256_step_2(SC_VERIFY);
}